

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_math_imul(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  JSValue val_00;
  JSValue JVar1;
  int iVar2;
  undefined8 in_RDX;
  JSContext *in_RSI;
  int32_t *in_RDI;
  int b;
  int a;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 local_28;
  undefined4 uStack_c;
  
  val.tag._0_4_ = in_stack_ffffffffffffffd0;
  val.u.ptr = (void *)in_RDX;
  val.tag._4_4_ = in_stack_ffffffffffffffd4;
  iVar2 = JS_ToInt32(in_RSI,in_RDI,val);
  if (iVar2 == 0) {
    val_00.tag._0_4_ = in_stack_ffffffffffffffd0;
    val_00.u.ptr = (void *)in_RDX;
    val_00.tag._4_4_ = in_stack_ffffffffffffffd4;
    iVar2 = JS_ToInt32(in_RSI,in_RDI,val_00);
    if (iVar2 == 0) {
      iVar2 = local_5c * local_60;
      local_28 = 0;
      in_stack_ffffffffffffffd4 = uStack_c;
    }
    else {
      iVar2 = 0;
      local_28 = 6;
    }
  }
  else {
    iVar2 = 0;
    local_28 = 6;
  }
  JVar1.u._4_4_ = in_stack_ffffffffffffffd4;
  JVar1.u.int32 = iVar2;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_math_imul(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv)
{
    int a, b;

    if (JS_ToInt32(ctx, &a, argv[0]))
        return JS_EXCEPTION;
    if (JS_ToInt32(ctx, &b, argv[1]))
        return JS_EXCEPTION;
    /* purposely ignoring overflow */
    return JS_NewInt32(ctx, a * b);
}